

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_cast_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,CastExpression *expr,
          idx_t depth)

{
  LogicalType *type;
  Binder *this_00;
  ClientContext *pCVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  undefined8 uVar3;
  bool bVar4;
  type expr_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  type expr_01;
  allocator local_171;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_170;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_168;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_160;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_158;
  undefined1 local_150 [32];
  ErrorData error;
  ErrorData local_b0;
  
  Bind(&error,this,&expr->child,depth,false);
  if (error.initialized == true) {
    ErrorData::ErrorData(&local_b0,&error);
    BindResult::BindResult(__return_storage_ptr__,&local_b0);
    ErrorData::~ErrorData(&local_b0);
  }
  else {
    this_00 = this->binder;
    ::std::__cxx11::string::string((string *)local_150,anon_var_dwarf_3b2a81b + 9,&local_171);
    type = &expr->cast_type;
    Binder::BindLogicalType
              (this_00,type,(optional_ptr<duckdb::Catalog,_true>)0x0,(string *)local_150);
    ::std::__cxx11::string::~string((string *)local_150);
    expr_00 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(&expr->child);
    this_01 = BoundExpression::GetExpression(expr_00);
    if (expr->try_cast == true) {
      expr_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(this_01);
      GetExpressionReturnType((LogicalType *)local_150,expr_01);
      bVar4 = LogicalType::operator==((LogicalType *)local_150,type);
      LogicalType::~LogicalType((LogicalType *)local_150);
      if (bVar4) {
        local_158._M_head_impl =
             (this_01->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        BindResult::BindResult
                  (__return_storage_ptr__,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_158);
        if (local_158._M_head_impl != (Expression *)0x0) {
          (*((local_158._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_158._M_head_impl = (Expression *)0x0;
        goto LAB_0128542e;
      }
      pCVar1 = this->context;
      local_160._M_head_impl =
           (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)local_150,pCVar1,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_160,type,true);
      uVar3 = local_150._0_8_;
      local_150._0_8_ = (long *)0x0;
      _Var2._M_head_impl =
           (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar3;
      if (_Var2._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
        if ((long *)local_150._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_150._0_8_ + 8))();
        }
      }
      local_150._0_8_ = (Expression *)0x0;
      if (local_160._M_head_impl != (Expression *)0x0) {
        (*((local_160._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_160._M_head_impl = (Expression *)0x0;
    }
    else {
      pCVar1 = this->context;
      local_168._M_head_impl =
           (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)local_150,pCVar1,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_168,type,false);
      uVar3 = local_150._0_8_;
      local_150._0_8_ = (long *)0x0;
      _Var2._M_head_impl =
           (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar3;
      if (_Var2._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
        if ((long *)local_150._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_150._0_8_ + 8))();
        }
      }
      local_150._0_8_ = (Expression *)0x0;
      if (local_168._M_head_impl != (Expression *)0x0) {
        (*((local_168._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_168._M_head_impl = (Expression *)0x0;
    }
    local_170._M_head_impl =
         (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_170);
    if (local_170._M_head_impl != (Expression *)0x0) {
      (*((local_170._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_170._M_head_impl = (Expression *)0x0;
  }
LAB_0128542e:
  ErrorData::~ErrorData(&error);
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindExpression(CastExpression &expr, idx_t depth) {
	// first try to bind the child of the cast expression
	auto error = Bind(expr.child, depth);
	if (error.HasError()) {
		return BindResult(std::move(error));
	}
	// FIXME: We can also implement 'hello'::schema.custom_type; and pass by the schema down here.
	// Right now just considering its DEFAULT_SCHEMA always
	binder.BindLogicalType(expr.cast_type);
	// the children have been successfully resolved
	auto &child = BoundExpression::GetExpression(*expr.child);
	if (expr.try_cast) {
		if (ExpressionBinder::GetExpressionReturnType(*child) == expr.cast_type) {
			// no cast required: type matches
			return BindResult(std::move(child));
		}
		child = BoundCastExpression::AddCastToType(context, std::move(child), expr.cast_type, true);
	} else {
		// otherwise add a cast to the target type
		child = BoundCastExpression::AddCastToType(context, std::move(child), expr.cast_type);
	}
	return BindResult(std::move(child));
}